

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputable.cpp
# Opt level: O0

bool snestistics::decode_static_jump
               (uint8_t opcode,RomAccessor *rom,Pointer pc,Pointer *target,Pointer *secondary_target
               )

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint16_t operand;
  Pointer PVar4;
  ushort *puVar5;
  Pointer p_1;
  Pointer p;
  Pointer *secondary_target_local;
  Pointer *target_local;
  Pointer pc_local;
  RomAccessor *rom_local;
  uint8_t opcode_local;
  
  *target = 0xffffffff;
  *secondary_target = 0xffffffff;
  if (opcode == 0x82) {
    operand = RomAccessor::eval16(rom,pc + 1);
    PVar4 = branch16(pc,operand);
    *target = PVar4;
  }
  else if ((branches[opcode] & 1) == 0) {
    if (opcode == 'L') {
      puVar5 = (ushort *)RomAccessor::evalPtr(rom,pc + 1);
      *target = pc & 0xff0000 | (uint)*puVar5;
    }
    else if (opcode == '\\') {
      uVar1 = RomAccessor::evalByte(rom,pc + 1);
      uVar2 = RomAccessor::evalByte(rom,pc + 2);
      uVar3 = RomAccessor::evalByte(rom,pc + 3);
      *target = (uint)CONCAT12(uVar3,CONCAT11(uVar2,uVar1));
    }
    else if (((opcode != 'l') && (opcode != 0xdc)) && (opcode != '|')) {
      return false;
    }
  }
  else {
    uVar1 = RomAccessor::evalByte(rom,pc + 1);
    PVar4 = branch8(pc,uVar1);
    *target = PVar4;
    if (opcode != 0x80) {
      *secondary_target = pc + 2;
    }
  }
  return true;
}

Assistant:

bool decode_static_jump(uint8_t opcode, const snestistics::RomAccessor & rom, const Pointer pc, Pointer * target, Pointer * secondary_target) {
	*target = INVALID_POINTER;
	*secondary_target = INVALID_POINTER;
	if (opcode == 0x82) { // BRL
		*target = branch16(pc, rom.eval16(pc+1));
	} else if (branches[opcode]) {
		*target = branch8(pc, rom.evalByte(pc + 1));
		if (opcode != 0x80) {
			*secondary_target = pc + 2;
		}
	} else if (opcode == 0x4C) { // Absolute jump
		Pointer p = *(uint16_t*)rom.evalPtr(pc + 1);
		p |= pc & 0xFF0000;
		*target = p;
	} else if (opcode == 0x5C) { // Absolute long jump
		Pointer p = 0;
		p |= rom.evalByte(pc + 1);
		p |= rom.evalByte(pc + 2) << 8;
		p |= rom.evalByte(pc + 3) << 16;
		*target = p;
	} else if (opcode == 0x6C || opcode == 0xDC) {
		// TODO: In this case the indirection pointer is located in bank 0 (with 16-bit address from operand)
		// Most often it will come from 7E but I guess sometimes it might actually be in bank 0... Then we could use it...
		// leave as INVALID_POINTER
	} else if (opcode == 0x7C) {
		// Indeterminate due to unknown value of X, leave as INVALID_POINTER
	}
	else {
		return false;
	}
	return true;
}